

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  byte in_R9B;
  
  *in_RDI = in_RSI;
  memcpy(in_RDI + 1,in_RDX,0x40);
  std::__cxx11::string::string
            ((string *)(in_RDI + 9),(string *)CONCAT71(in_register_00000009,in_CL));
  std::__cxx11::string::string((string *)(in_RDI + 0xd),in_R8);
  *(byte *)(in_RDI + 0x11) = in_R9B & 1;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string&& _stdOut,
                                   std::string&& _stdErr,
                                   bool _aborting )
    : testInfo( &_testInfo ),
        totals( _totals ),
        stdOut( CATCH_MOVE(_stdOut) ),
        stdErr( CATCH_MOVE(_stdErr) ),
        aborting( _aborting )
    {}